

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_sameName(ENCODING *enc,char *ptr1,char *ptr2)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  
LAB_004e1319:
  bVar1 = *ptr1;
  uVar2 = (uint)bVar1;
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
switchD_004e13a1_caseD_7:
      if (bVar1 != *ptr2) {
        return 0;
      }
      ptr2 = (char *)((byte *)ptr2 + 1);
      bVar4 = ((byte *)ptr1)[1];
      ptr1 = (char *)((byte *)ptr1 + 1);
      goto switchD_004e13a1_caseD_6;
    }
    if (uVar2 == 0) {
      bVar4 = 0;
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr1)[1])) {
      case 5:
        goto switchD_004e13a1_caseD_5;
      case 6:
        goto switchD_004e13a1_caseD_6;
      case 7:
        goto switchD_004e13a1_caseD_7;
      default:
        goto switchD_004e13a1_caseD_8;
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1d:
        break;
      }
    }
  }
  else if (uVar2 == 0xff) {
    if (0xfd < ((byte *)ptr1)[1]) {
switchD_004e13a1_caseD_8:
      bVar1 = *ptr2;
      if (bVar1 - 0xdc < 4) {
        return 1;
      }
      if (bVar1 == 0) {
        bVar1 = *(char *)((long)enc[1].scanners + (ulong)((byte *)ptr2)[1]) - 5;
        if (0x18 < bVar1) {
          return 1;
        }
        iVar3 = *(int *)(&DAT_005d4418 + (ulong)bVar1 * 4);
      }
      else {
        iVar3 = 0;
        if ((bVar1 == 0xff) && (0xfd < ((byte *)ptr2)[1])) {
          return 1;
        }
      }
      return iVar3;
    }
  }
  else if (uVar2 - 0xdc < 4) goto switchD_004e13a1_caseD_8;
  if (*ptr2 != bVar1) {
    return 0;
  }
  if (((byte *)ptr2)[1] != ((byte *)ptr1)[1]) {
    return 0;
  }
LAB_004e13be:
  ptr2 = (char *)((byte *)ptr2 + 2);
  ptr1 = (char *)((byte *)ptr1 + 2);
  goto LAB_004e1319;
switchD_004e13a1_caseD_6:
  if (bVar4 != *ptr2) {
    return 0;
  }
  ptr2 = (char *)((byte *)ptr2 + 1);
  bVar4 = ((byte *)ptr1)[1];
  ptr1 = (char *)((byte *)ptr1 + 1);
switchD_004e13a1_caseD_5:
  if (bVar4 != *ptr2) {
    return 0;
  }
  if (((byte *)ptr1)[1] != ((byte *)ptr2)[1]) {
    return 0;
  }
  goto LAB_004e13be;
}

Assistant:

static
int PREFIX(sameName)(const ENCODING *enc, const char *ptr1, const char *ptr2)
{
  for (;;) {
    switch (BYTE_TYPE(enc, ptr1)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (*ptr1++ != *ptr2++) \
        return 0;
    LEAD_CASE(4) LEAD_CASE(3) LEAD_CASE(2)
#undef LEAD_CASE
      /* fall through */
      if (*ptr1++ != *ptr2++)
        return 0;
      break;
    case BT_NONASCII:
    case BT_NMSTRT:
#ifdef XML_NS
    case BT_COLON:
#endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      if (*ptr2++ != *ptr1++)
        return 0;
      if (MINBPC(enc) > 1) {
        if (*ptr2++ != *ptr1++)
          return 0;
        if (MINBPC(enc) > 2) {
          if (*ptr2++ != *ptr1++)
            return 0;
          if (MINBPC(enc) > 3) {
            if (*ptr2++ != *ptr1++)
              return 0;
          }
        }
      }
      break;
    default:
      if (MINBPC(enc) == 1 && *ptr1 == *ptr2)
        return 1;
      switch (BYTE_TYPE(enc, ptr2)) {
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
      case BT_NONASCII:
      case BT_NMSTRT:
#ifdef XML_NS
      case BT_COLON:
#endif
      case BT_HEX:
      case BT_DIGIT:
      case BT_NAME:
      case BT_MINUS:
        return 0;
      default:
        return 1;
      }
    }
  }
  /* not reached */
}